

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ExpressionValue * __thiscall
ExpressionValue::operator~(ExpressionValue *__return_storage_ptr__,ExpressionValue *this)

{
  bool bVar1;
  ExpressionValue *this_local;
  ExpressionValue *result;
  
  ExpressionValue(__return_storage_ptr__);
  bVar1 = isInt(this);
  if (bVar1) {
    __return_storage_ptr__->type = Integer;
    (__return_storage_ptr__->field_1).intValue = (this->field_1).intValue ^ 0xffffffffffffffff;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator~() const
{
	ExpressionValue result;

	if (isInt())
	{
		result.type = ExpressionValueType::Integer;
		result.intValue = ~intValue;
	}

	return result;
}